

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

bool __thiscall
yactfr::internal::Vm::_newDataBlock(Vm *this,Index offsetInElemSeqBytes,Size sizeBytes)

{
  bool bVar1;
  pointer this_00;
  pointer_const_type pDVar2;
  uint8_t *puVar3;
  Size SVar4;
  undefined1 local_40 [8];
  optional<yactfr::DataBlock> dataBlock;
  Size sizeBytes_local;
  Index offsetInElemSeqBytes_local;
  Vm *this_local;
  
  dataBlock.super_type.m_storage.dummy_._8_8_ = sizeBytes;
  if (9 < sizeBytes) {
    __assert_fail("sizeBytes <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/vm.cpp"
                  ,0x172,"bool yactfr::internal::Vm::_newDataBlock(const Index, const Size)");
  }
  this_00 = std::unique_ptr<yactfr::DataSource,_std::default_delete<yactfr::DataSource>_>::
            operator->(&this->_dataSrc);
  DataSource::data((optional<yactfr::DataBlock> *)local_40,this_00,offsetInElemSeqBytes,
                   dataBlock.super_type.m_storage.dummy_._8_8_);
  bVar1 = boost::optional<yactfr::DataBlock>::operator!((optional<yactfr::DataBlock> *)local_40);
  if (!bVar1) {
    pDVar2 = boost::optional<yactfr::DataBlock>::operator->((optional<yactfr::DataBlock> *)local_40)
    ;
    puVar3 = (uint8_t *)DataBlock::address(pDVar2);
    this->_bufAddr = puVar3;
    pDVar2 = boost::optional<yactfr::DataBlock>::operator->((optional<yactfr::DataBlock> *)local_40)
    ;
    SVar4 = DataBlock::size(pDVar2);
    this->_bufLenBits = SVar4 << 3;
    this->_bufOffsetInCurPktBits = offsetInElemSeqBytes * 8 - (this->_pos).curPktOffsetInElemSeqBits
    ;
  }
  this_local._7_1_ = !bVar1;
  boost::optional<yactfr::DataBlock>::~optional((optional<yactfr::DataBlock> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Vm::_newDataBlock(const Index offsetInElemSeqBytes, const Size sizeBytes)
{
    assert(sizeBytes <= 9);

    const auto dataBlock = _dataSrc->data(offsetInElemSeqBytes, sizeBytes);

    if (!dataBlock) {
        // no data
        return false;
    }

    _bufAddr = static_cast<const std::uint8_t *>(dataBlock->address());
    _bufLenBits = dataBlock->size() * 8;
    _bufOffsetInCurPktBits = offsetInElemSeqBytes * 8 - _pos.curPktOffsetInElemSeqBits;
    return true;
}